

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::match_semicolon(Token *__return_storage_ptr__,Lexer *this)

{
  Position local_48;
  TokenPosition local_38;
  Type local_20;
  bool local_19;
  Lexer *local_18;
  Lexer *this_local;
  
  local_19 = true;
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  consume(this,&local_19);
  local_20 = kSemicolon;
  Position::Position(&local_48,&(this->position_).super_Position);
  TokenPosition::TokenPosition(&local_38,&local_48,1);
  Token::Token(__return_storage_ptr__,&local_20,&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_semicolon() {
    consume();
    return Token(Token::Type::kSemicolon, TokenPosition(position_, 1));
}